

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vertex_sequence.h
# Opt level: O3

void __thiscall
agg::vertex_sequence<agg::vertex_dist,_6U>::add
          (vertex_sequence<agg::vertex_dist,_6U> *this,vertex_dist *val)

{
  vertex_dist **ppvVar1;
  vertex_dist *pvVar2;
  vertex_dist *pvVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  double dVar8;
  
  uVar5 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
  if (1 < uVar5) {
    ppvVar1 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks;
    pvVar2 = ppvVar1[uVar5 - 2 >> 6];
    uVar6 = uVar5 - 2 & 0x3f;
    uVar7 = uVar5 - 1;
    pvVar3 = ppvVar1[uVar7 >> 6];
    dVar4 = pvVar3[uVar7 & 0x3f].x - pvVar2[uVar6].x;
    dVar8 = pvVar3[uVar7 & 0x3f].y - pvVar2[uVar6].y;
    dVar4 = SQRT(dVar4 * dVar4 + dVar8 * dVar8);
    pvVar2[uVar6].dist =
         (double)(~-(ulong)(1e-14 < dVar4) & 0x42d6bcc41e900000 |
                 (ulong)dVar4 & -(ulong)(1e-14 < dVar4));
    if (dVar4 <= 1e-14) {
      (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size = uVar7;
      uVar5 = uVar7;
    }
  }
  uVar7 = uVar5 >> 6;
  if ((this->super_pod_bvector<agg::vertex_dist,_6U>).m_num_blocks <= uVar7) {
    pod_bvector<agg::vertex_dist,_6U>::allocate_block
              (&this->super_pod_bvector<agg::vertex_dist,_6U>,uVar7);
    uVar5 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
  }
  pvVar2 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks[uVar7];
  pvVar2[uVar5 & 0x3f].dist = val->dist;
  dVar4 = val->y;
  pvVar2 = pvVar2 + (uVar5 & 0x3f);
  pvVar2->x = val->x;
  pvVar2->y = dVar4;
  (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size =
       (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size + 1;
  return;
}

Assistant:

void vertex_sequence<T, S>::add(const T& val)
    {
        if(base_type::size() > 1)
        {
            if(!(*this)[base_type::size() - 2]((*this)[base_type::size() - 1])) 
            {
                base_type::remove_last();
            }
        }
        base_type::add(val);
    }